

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::AffineTransform
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *this,TPZVec<TPZTransform<double>_> *trVec)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  TPZGeoElSide *neighbour;
  TPZCompElSide *pTVar4;
  TPZTransform<double> *this_00;
  TPZVec<TPZTransform<double>_> *in_RSI;
  long in_RDI;
  TPZGeoElSide highdim;
  TPZGeoElSide neighgeoside;
  TPZGeoElSide thisgeoside;
  TPZTransform<double> LocalTransf;
  TPZGeoElSide gelmfside;
  TPZGeoElSide gelside;
  TPZTransform<double> tr;
  int64_t i;
  TPZGeoEl *geoel;
  TPZGeoEl *gelmf;
  int dimmf;
  int dim;
  int side;
  int64_t nel;
  TPZTransform<double> *in_stack_fffffffffffff668;
  TPZTransform<double> *in_stack_fffffffffffff670;
  int side_00;
  undefined4 in_stack_fffffffffffff678;
  undefined4 in_stack_fffffffffffff67c;
  TPZGeoEl *in_stack_fffffffffffff680;
  TPZGeoEl *in_stack_fffffffffffff688;
  TPZTransform<double> *right;
  int in_stack_fffffffffffff6ac;
  TPZTransform<double> *in_stack_fffffffffffff6b0;
  TPZTransform<double> *in_stack_fffffffffffff6c0;
  undefined4 in_stack_fffffffffffff6c8;
  int in_stack_fffffffffffff6cc;
  undefined1 local_5c0 [488];
  undefined1 local_3d8 [504];
  undefined1 local_1e0 [416];
  int64_t local_40;
  TPZGeoEl *local_38;
  TPZGeoEl *local_30;
  int local_24;
  
  neighbour = (TPZGeoElSide *)TPZVec<TPZCompElSide>::size((TPZVec<TPZCompElSide> *)(in_RDI + 0x78));
  (*in_RSI->_vptr_TPZVec[3])(in_RSI,neighbour);
  local_30 = TPZCompEl::Reference
                       ((TPZCompEl *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  local_24 = (**(code **)(*(long *)local_30 + 0x210))();
  iVar2 = (**(code **)(*(long *)local_30 + 0xf0))();
  iVar2 = iVar2 + -1;
  for (local_40 = 0; local_40 < (long)neighbour; local_40 = local_40 + 1) {
    pTVar4 = TPZVec<TPZCompElSide>::operator[]((TPZVec<TPZCompElSide> *)(in_RDI + 0x78),local_40);
    bVar1 = TPZCompElSide::operator_cast_to_bool(pTVar4);
    if (bVar1) {
      pTVar4 = TPZVec<TPZCompElSide>::operator[]((TPZVec<TPZCompElSide> *)(in_RDI + 0x78),local_40);
      TPZCompElSide::Element(pTVar4);
      local_38 = TPZCompEl::Reference
                           ((TPZCompEl *)
                            CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
      iVar3 = (**(code **)(*(long *)local_38 + 0x210))();
      if (iVar3 == local_24) {
        TPZTransform<double>::TPZTransform(in_stack_fffffffffffff6b0,in_stack_fffffffffffff6ac);
        (**(code **)(*(long *)local_38 + 0xf0))();
        TPZGeoElSide::TPZGeoElSide
                  ((TPZGeoElSide *)in_stack_fffffffffffff680,
                   (TPZGeoEl *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                   (int)((ulong)in_stack_fffffffffffff670 >> 0x20));
        TPZGeoElSide::TPZGeoElSide
                  ((TPZGeoElSide *)in_stack_fffffffffffff680,
                   (TPZGeoEl *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                   (int)((ulong)in_stack_fffffffffffff670 >> 0x20));
        in_stack_fffffffffffff6cc =
             TPZGeoElSide::NeighbourExists
                       ((TPZGeoElSide *)
                        CONCAT44(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8),
                        (TPZGeoElSide *)in_stack_fffffffffffff6c0);
        if (in_stack_fffffffffffff6cc == 0) {
          (**(code **)(*(long *)local_30 + 600))(local_3d8,local_30,iVar2,local_38,local_1e0);
          in_stack_fffffffffffff6b0 = TPZVec<TPZTransform<double>_>::operator[](in_RSI,local_40);
          TPZTransform<double>::operator=(in_stack_fffffffffffff670,in_stack_fffffffffffff668);
          TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x1b6aa38);
        }
        else {
          in_stack_fffffffffffff6c0 = TPZVec<TPZTransform<double>_>::operator[](in_RSI,local_40);
          TPZTransform<double>::operator=(in_stack_fffffffffffff670,in_stack_fffffffffffff668);
          TPZGeoElSide::TPZGeoElSide
                    ((TPZGeoElSide *)in_stack_fffffffffffff670,
                     (TPZGeoElSide *)in_stack_fffffffffffff668);
          TPZVec<TPZTransform<double>_>::operator[](in_RSI,local_40);
          TPZGeoElSide::SideTransform3
                    ((TPZGeoElSide *)in_RSI,neighbour,(TPZTransform<double> *)CONCAT44(iVar2,iVar3))
          ;
          TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1b6a950);
        }
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1b6aa6a);
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1b6aa77);
        TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x1b6aa84);
      }
      else {
        TPZTransform<double>::TPZTransform(in_stack_fffffffffffff6b0,in_stack_fffffffffffff6ac);
        in_stack_fffffffffffff6ac = (**(code **)(*(long *)local_30 + 0xf0))();
        TPZGeoElSide::TPZGeoElSide
                  ((TPZGeoElSide *)in_stack_fffffffffffff680,
                   (TPZGeoEl *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                   (int)((ulong)in_stack_fffffffffffff670 >> 0x20));
        this_00 = (TPZTransform<double> *)
                  TPZVec<TPZCompElSide>::operator[]
                            ((TPZVec<TPZCompElSide> *)(in_RDI + 0x78),local_40);
        TPZCompElSide::Reference((TPZCompElSide *)in_stack_fffffffffffff688);
        right = (TPZTransform<double> *)local_5c0;
        TPZGeoElSide::TPZGeoElSide
                  ((TPZGeoElSide *)in_stack_fffffffffffff670,
                   (TPZGeoElSide *)in_stack_fffffffffffff668);
        side_00 = (int)((ulong)in_stack_fffffffffffff670 >> 0x20);
        TPZGeoElSide::SideTransform3
                  ((TPZGeoElSide *)in_RSI,neighbour,(TPZTransform<double> *)CONCAT44(iVar2,iVar3));
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1b6ab76);
        in_stack_fffffffffffff688 = TPZGeoElSide::Element((TPZGeoElSide *)(local_5c0 + 0x18));
        in_stack_fffffffffffff680 = TPZGeoElSide::Element((TPZGeoElSide *)(local_5c0 + 0x18));
        in_stack_fffffffffffff67c = (**(code **)(*(long *)in_stack_fffffffffffff680 + 0xf0))();
        TPZGeoElSide::TPZGeoElSide
                  ((TPZGeoElSide *)in_stack_fffffffffffff680,
                   (TPZGeoEl *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),side_00
                  );
        TPZGeoElSide::SideToSideTransform((TPZGeoElSide *)this_00,(TPZGeoElSide *)right);
        TPZTransform<double>::Multiply(this_00,right);
        in_stack_fffffffffffff670 = TPZVec<TPZTransform<double>_>::operator[](in_RSI,local_40);
        TPZTransform<double>::operator=(in_stack_fffffffffffff670,in_stack_fffffffffffff668);
        TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x1b6ac4a);
        TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x1b6ac57);
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1b6ac64);
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1b6ac71);
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1b6ac7e);
        TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x1b6ac8b);
      }
    }
  }
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::AffineTransform(TPZVec<TPZTransform<> > &trVec) const
{
    int64_t nel;
    int side, dim, dimmf;
    nel=fElementVec.size();
    trVec.Resize(nel);
    TPZGeoEl *gelmf = Reference();
    dimmf = gelmf->Dimension();
    side = gelmf->NSides()-1;
    TPZGeoEl  *geoel;
    for (int64_t i = 0; i<nel; i++) {
        if (!fElementVec[i]) {
            continue;
        }
        geoel = fElementVec[i].Element()->Reference();
        dim =  geoel->Dimension();
        if (dim == dimmf) {
            TPZTransform<> tr(dim);
            TPZGeoElSide gelside(geoel,geoel->NSides()-1);
            TPZGeoElSide gelmfside(gelmf,side);
            if (gelside.NeighbourExists(gelmfside))
            {
                trVec[i] = tr;
                gelmfside.SideTransform3(gelside, trVec[i]);
            }
            else
            {
                trVec[i] = gelmf->BuildTransform2(side, geoel, tr);
            }
        }
        else
        {
            TPZTransform<> LocalTransf(dimmf);
            TPZGeoElSide thisgeoside(gelmf,gelmf->NSides()-1);
            TPZGeoElSide neighgeoside = fElementVec[i].Reference();
            thisgeoside.SideTransform3(neighgeoside, LocalTransf);
            TPZGeoElSide highdim(neighgeoside.Element(), neighgeoside.Element()->NSides()-1);
            trVec[i] = neighgeoside.SideToSideTransform(highdim).Multiply(LocalTransf);
            
        }
    }
}